

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

int If_CluCheckExt3(void *pMan,word *pTruth,int nVars,int nLutLeaf,int nLutLeaf2,int nLutRoot,
                   char *pLut0,char *pLut1,char *pLut2,word *pFunc0,word *pFunc1,word *pFunc2)

{
  If_Grp_t R;
  If_Grp_t G2;
  If_Grp_t local_66;
  If_Grp_t local_54;
  If_Grp_t local_42;
  
  If_CluCheck3(&local_66,(If_Man_t *)pMan,pTruth,nVars,nLutLeaf,nLutLeaf2,nLutRoot,&local_54,
               &local_42,pFunc0,pFunc1,pFunc2);
  *(undefined2 *)(pLut0 + 0x10) = local_54.pVars._14_2_;
  pLut0[0] = local_54.nVars;
  pLut0[1] = local_54.nMyu;
  pLut0[2] = local_54.pVars[0];
  pLut0[3] = local_54.pVars[1];
  pLut0[4] = local_54.pVars[2];
  pLut0[5] = local_54.pVars[3];
  pLut0[6] = local_54.pVars[4];
  pLut0[7] = local_54.pVars[5];
  *(undefined8 *)(pLut0 + 8) = local_54.pVars._6_8_;
  *pLut1 = local_66.nVars;
  pLut1[0x11] = local_66.pVars[0xf];
  pLut1[1] = local_66.nMyu;
  pLut1[2] = local_66.pVars[0];
  pLut1[3] = local_66.pVars[1];
  pLut1[4] = local_66.pVars[2];
  pLut1[5] = local_66.pVars[3];
  pLut1[6] = local_66.pVars[4];
  pLut1[7] = local_66.pVars[5];
  pLut1[8] = local_66.pVars[6];
  *(undefined8 *)(pLut1 + 9) = local_66.pVars._7_8_;
  *(undefined2 *)(pLut2 + 0x10) = local_42.pVars._14_2_;
  pLut2[0] = local_42.nVars;
  pLut2[1] = local_42.nMyu;
  pLut2[2] = local_42.pVars[0];
  pLut2[3] = local_42.pVars[1];
  pLut2[4] = local_42.pVars[2];
  pLut2[5] = local_42.pVars[3];
  pLut2[6] = local_42.pVars[4];
  pLut2[7] = local_42.pVars[5];
  *(undefined8 *)(pLut2 + 8) = local_42.pVars._6_8_;
  return (int)('\0' < local_66.nVars);
}

Assistant:

int If_CluCheckExt3( void * pMan, word * pTruth, int nVars, int nLutLeaf, int nLutLeaf2, int nLutRoot, 
                    char * pLut0, char * pLut1, char * pLut2, word * pFunc0, word * pFunc1, word * pFunc2 )
{
    If_Man_t * p = (If_Man_t *)pMan;
    If_Grp_t G, G2, R;
    G = If_CluCheck3( p, pTruth, nVars, nLutLeaf, nLutLeaf2, nLutRoot, &R, &G2, pFunc0, pFunc1, pFunc2 );
    memcpy( pLut0, &R, sizeof(If_Grp_t) );
    memcpy( pLut1, &G, sizeof(If_Grp_t) );
    memcpy( pLut2, &G2, sizeof(If_Grp_t) );
    return (G.nVars > 0);
}